

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O3

void __thiscall boost::condition_error::condition_error(condition_error *this,int ev,char *what_arg)

{
  error_category *peVar1;
  
  peVar1 = system::generic_category();
  std::runtime_error::runtime_error((runtime_error *)this,what_arg);
  (this->super_system_error).m_error_code.m_val = ev;
  (this->super_system_error).m_error_code.m_cat = peVar1;
  (this->super_system_error).m_what._M_dataplus._M_p =
       (pointer)&(this->super_system_error).m_what.field_2;
  (this->super_system_error).m_what._M_string_length = 0;
  (this->super_system_error).m_what.field_2._M_local_buf[0] = '\0';
  *(undefined ***)&this->super_system_error = &PTR__system_error_001ccab8;
  return;
}

Assistant:

condition_error( int ev, const char * what_arg )
          : base_type(system::error_code(ev, system::generic_category()), what_arg)
          {
          }